

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

void __thiscall
deqp::sl::ShaderParser::parseShaderCase
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  ShaderCase *pSVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *fragmentSource_00;
  ShaderCase *local_248;
  ShaderCase *local_240;
  ShaderCase *local_238;
  undefined1 local_230 [8];
  string fragName;
  string vertName;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  undefined1 local_1a0 [8];
  string postfix;
  undefined1 local_178 [4];
  int versionNum;
  string source;
  undefined1 local_150 [4];
  Token token;
  ValueBlock block;
  string local_110;
  string local_f0 [8];
  string fragmentSource;
  string vertexSource;
  string bothSource;
  string description;
  ExpectResult expectResult;
  GLSLVersion version;
  vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
  valueBlockList;
  undefined1 local_40 [8];
  string caseName;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList_local;
  ShaderParser *this_local;
  
  caseName.field_2._8_8_ = shaderNodeList;
  advanceToken(this,TOKEN_CASE);
  std::__cxx11::string::string((string *)local_40,(string *)&this->m_curTokenStr);
  advanceToken(this);
  std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
  vector((vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
          *)&expectResult);
  description.field_2._12_4_ = 0;
  description.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)(bothSource.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(vertexSource.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fragmentSource.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_f0);
  while (this->m_curToken != TOKEN_END) {
    if (this->m_curToken == TOKEN_DESC) {
      advanceToken(this);
      assumeToken(this,TOKEN_STRING);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      parseStringLiteral_abi_cxx11_(&local_110,this,pcVar7);
      std::__cxx11::string::operator=
                ((string *)(bothSource.field_2._M_local_buf + 8),(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      advanceToken(this);
    }
    else if (this->m_curToken == TOKEN_EXPECT) {
      advanceToken(this);
      assumeToken(this,TOKEN_IDENTIFIER);
      bVar4 = std::operator==(&this->m_curTokenStr,"pass");
      if (bVar4) {
        description.field_2._8_4_ = 0;
      }
      else {
        bVar4 = std::operator==(&this->m_curTokenStr,"compile_fail");
        if (bVar4) {
          description.field_2._8_4_ = 1;
        }
        else {
          bVar4 = std::operator==(&this->m_curTokenStr,"link_fail");
          if (bVar4) {
            description.field_2._8_4_ = 2;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &block.values.
                            super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "invalid expected result value: ",&this->m_curTokenStr);
            parseError(this,(string *)
                            &block.values.
                             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &block.values.
                        super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
        }
      }
      advanceToken(this);
    }
    else if (this->m_curToken == TOKEN_VALUES) {
      ShaderCase::ValueBlock::ValueBlock((ValueBlock *)local_150);
      parseValueBlock(this,(ValueBlock *)local_150);
      std::
      vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
      push_back((vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                 *)&expectResult,(value_type *)local_150);
      ShaderCase::ValueBlock::~ValueBlock((ValueBlock *)local_150);
    }
    else if (((this->m_curToken == TOKEN_BOTH) || (this->m_curToken == TOKEN_VERTEX)) ||
            (this->m_curToken == TOKEN_FRAGMENT)) {
      source.field_2._12_4_ = this->m_curToken;
      advanceToken(this);
      assumeToken(this,TOKEN_SHADER_SOURCE);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      parseShaderSource_abi_cxx11_((string *)local_178,this,pcVar7);
      advanceToken(this);
      if (source.field_2._12_4_ == 0xf) {
        std::__cxx11::string::operator=
                  ((string *)(vertexSource.field_2._M_local_buf + 8),(string *)local_178);
      }
      else if (source.field_2._12_4_ == 0x10) {
        std::__cxx11::string::operator=
                  ((string *)(fragmentSource.field_2._M_local_buf + 8),(string *)local_178);
      }
      else if (source.field_2._12_4_ == 0x11) {
        std::__cxx11::string::operator=(local_f0,(string *)local_178);
      }
      std::__cxx11::string::~string((string *)local_178);
    }
    else if (this->m_curToken == TOKEN_VERSION) {
      advanceToken(this);
      postfix.field_2._12_4_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"",&local_1a1);
      std::allocator<char>::~allocator(&local_1a1);
      assumeToken(this,TOKEN_INT_LITERAL);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      postfix.field_2._12_4_ = parseIntLiteral(this,pcVar7);
      advanceToken(this);
      if (this->m_curToken == TOKEN_IDENTIFIER) {
        std::__cxx11::string::operator=((string *)local_1a0,(string *)&this->m_curTokenStr);
        advanceToken(this);
      }
      if ((postfix.field_2._12_4_ == 100) &&
         (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a0,"es"), bVar4)) {
        description.field_2._12_4_ = 0;
      }
      else if ((postfix.field_2._12_4_ == 300) &&
              (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a0,"es"), bVar4)) {
        description.field_2._12_4_ = 1;
      }
      else if ((postfix.field_2._12_4_ == 0x136) &&
              (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a0,"es"), bVar4)) {
        description.field_2._12_4_ = 2;
      }
      else if (postfix.field_2._12_4_ == 0x82) {
        description.field_2._12_4_ = 4;
      }
      else if (postfix.field_2._12_4_ == 0x8c) {
        description.field_2._12_4_ = 5;
      }
      else if (postfix.field_2._12_4_ == 0x96) {
        description.field_2._12_4_ = 6;
      }
      else if (postfix.field_2._12_4_ == 0x14a) {
        description.field_2._12_4_ = 7;
      }
      else if (postfix.field_2._12_4_ == 400) {
        description.field_2._12_4_ = 8;
      }
      else if (postfix.field_2._12_4_ == 0x19a) {
        description.field_2._12_4_ = 9;
      }
      else if (postfix.field_2._12_4_ == 0x1a4) {
        description.field_2._12_4_ = 10;
      }
      else if (postfix.field_2._12_4_ == 0x1ae) {
        description.field_2._12_4_ = 0xb;
      }
      else if (postfix.field_2._12_4_ == 0x1b8) {
        description.field_2._12_4_ = 0xc;
      }
      else if (postfix.field_2._12_4_ == 0x1c2) {
        description.field_2._12_4_ = 0xd;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"Unknown GLSL version",&local_1c9);
        parseError(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
      }
      std::__cxx11::string::~string((string *)local_1a0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vertName.field_2 + 8),"unexpected token while parsing shader case: ",
                     &this->m_curTokenStr);
      parseError(this,(string *)((long)&vertName.field_2 + 8));
      std::__cxx11::string::~string((string *)(vertName.field_2._M_local_buf + 8));
    }
  }
  advanceToken(this,TOKEN_END);
  lVar5 = std::__cxx11::string::length();
  uVar3 = caseName.field_2._8_8_;
  if (lVar5 == 0) {
    pSVar6 = (ShaderCase *)operator_new(0xe0);
    pTVar1 = this->m_testCtx;
    pRVar2 = this->m_renderCtx;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    fragmentSource_00 = (char *)std::__cxx11::string::c_str();
    ShaderCase::ShaderCase
              (pSVar6,pTVar1,pRVar2,pcVar7,pcVar8,description.field_2._8_4_,
               (vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                *)&expectResult,description.field_2._12_4_,pcVar9,fragmentSource_00);
    local_248 = pSVar6;
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,
               (value_type *)&local_248);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fragName.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "_vertex");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "_fragment");
    uVar3 = caseName.field_2._8_8_;
    pSVar6 = (ShaderCase *)operator_new(0xe0);
    pTVar1 = this->m_testCtx;
    pRVar2 = this->m_renderCtx;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    ShaderCase::ShaderCase
              (pSVar6,pTVar1,pRVar2,pcVar7,pcVar8,description.field_2._8_4_,
               (vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                *)&expectResult,description.field_2._12_4_,pcVar9,(char *)0x0);
    local_238 = pSVar6;
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,
               (value_type *)&local_238);
    uVar3 = caseName.field_2._8_8_;
    pSVar6 = (ShaderCase *)operator_new(0xe0);
    pTVar1 = this->m_testCtx;
    pRVar2 = this->m_renderCtx;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    ShaderCase::ShaderCase
              (pSVar6,pTVar1,pRVar2,pcVar7,pcVar8,description.field_2._8_4_,
               (vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                *)&expectResult,description.field_2._12_4_,(char *)0x0,pcVar9);
    local_240 = pSVar6;
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,
               (value_type *)&local_240);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string((string *)(fragName.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)(fragmentSource.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(vertexSource.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(bothSource.field_2._M_local_buf + 8));
  std::vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>::
  ~vector((vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
           *)&expectResult);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void ShaderParser::parseShaderCase(vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderCase()\n"));
	advanceToken(TOKEN_CASE);

	// Parse case name.
	string caseName = m_curTokenStr;
	advanceToken(); // \note [pyry] All token types are allowed here.

	// Setup case.
	vector<ShaderCase::ValueBlock> valueBlockList;

	GLSLVersion				 version	  = DEFAULT_GLSL_VERSION;
	ShaderCase::ExpectResult expectResult = ShaderCase::EXPECT_PASS;
	string					 description;
	string					 bothSource;
	string					 vertexSource;
	string					 fragmentSource;

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_DESC)
		{
			advanceToken();
			assumeToken(TOKEN_STRING);

			description = parseStringLiteral(m_curTokenStr.c_str());
			advanceToken();
		}
		else if (m_curToken == TOKEN_EXPECT)
		{
			advanceToken();
			assumeToken(TOKEN_IDENTIFIER);

			if (m_curTokenStr == "pass")
				expectResult = ShaderCase::EXPECT_PASS;
			else if (m_curTokenStr == "compile_fail")
				expectResult = ShaderCase::EXPECT_COMPILE_FAIL;
			else if (m_curTokenStr == "link_fail")
				expectResult = ShaderCase::EXPECT_LINK_FAIL;
			else
				parseError(string("invalid expected result value: " + m_curTokenStr));

			advanceToken();
		}
		else if (m_curToken == TOKEN_VALUES)
		{
			ShaderCase::ValueBlock block;
			parseValueBlock(block);
			valueBlockList.push_back(block);
		}
		else if (m_curToken == TOKEN_BOTH || m_curToken == TOKEN_VERTEX || m_curToken == TOKEN_FRAGMENT)
		{
			Token token = m_curToken;
			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			string source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();
			if (token == TOKEN_BOTH)
				bothSource = source;
			else if (token == TOKEN_VERTEX)
				vertexSource = source;
			else if (token == TOKEN_FRAGMENT)
				fragmentSource = source;
			else
				DE_ASSERT(DE_FALSE);
		}
		else if (m_curToken == TOKEN_VERSION)
		{
			advanceToken();

			int			versionNum = 0;
			std::string postfix	= "";

			assumeToken(TOKEN_INT_LITERAL);
			versionNum = parseIntLiteral(m_curTokenStr.c_str());
			advanceToken();

			if (m_curToken == TOKEN_IDENTIFIER)
			{
				postfix = m_curTokenStr;
				advanceToken();
			}

			if (versionNum == 100 && postfix == "es")
				version = glu::GLSL_VERSION_100_ES;
			else if (versionNum == 300 && postfix == "es")
				version = glu::GLSL_VERSION_300_ES;
			else if (versionNum == 310 && postfix == "es")
				version = glu::GLSL_VERSION_310_ES;
			else if (versionNum == 130)
				version = glu::GLSL_VERSION_130;
			else if (versionNum == 140)
				version = glu::GLSL_VERSION_140;
			else if (versionNum == 150)
				version = glu::GLSL_VERSION_150;
			else if (versionNum == 330)
				version = glu::GLSL_VERSION_330;
			else if (versionNum == 400)
				version = glu::GLSL_VERSION_400;
			else if (versionNum == 410)
				version = glu::GLSL_VERSION_410;
			else if (versionNum == 420)
				version = glu::GLSL_VERSION_420;
			else if (versionNum == 430)
				version = glu::GLSL_VERSION_430;
			else if (versionNum == 440)
				version = glu::GLSL_VERSION_440;
			else if (versionNum == 450)
				version = glu::GLSL_VERSION_450;
			else
				parseError("Unknown GLSL version");
		}
		else
			parseError(string("unexpected token while parsing shader case: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // case end

	if (bothSource.length() > 0)
	{
		DE_ASSERT(vertexSource.length() == 0);
		DE_ASSERT(fragmentSource.length() == 0);

		string vertName = caseName + "_vertex";
		string fragName = caseName + "_fragment";
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, vertName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, bothSource.c_str(), DE_NULL));
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, fragName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, DE_NULL, bothSource.c_str()));
	}
	else
	{
		shaderNodeList.push_back(new ShaderCase(m_testCtx, m_renderCtx, caseName.c_str(), description.c_str(),
												expectResult, valueBlockList, version, vertexSource.c_str(),
												fragmentSource.c_str()));
	}
}